

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall
Rml::Context::UpdateHoverChain
          (Context *this,Vector2i old_mouse_position,int key_modifier_state,
          Dictionary *out_parameters,Dictionary *out_drag_parameters)

{
  ScrollController *this_00;
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  pointer ppVar4;
  pointer ppVar5;
  pointer ppVar6;
  Vector2f point;
  Vector2f point_00;
  int iVar7;
  type pVVar8;
  ComputedValues *pCVar9;
  Element *this_01;
  SystemInterface *pSVar10;
  Context *pCVar11;
  undefined4 in_XMM0_Db;
  ElementSet new_hover_chain;
  ElementSet new_drag_hover_chain;
  Dictionary local_drag_parameters;
  Dictionary local_parameters;
  undefined1 local_d8 [40];
  Element *local_b0;
  String local_a8;
  float local_88;
  float fStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  Dictionary local_68;
  Dictionary local_48;
  
  local_88 = (float)(this->mouse_position).x;
  local_78 = ZEXT416((uint)(float)(this->mouse_position).y);
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (out_parameters == (Dictionary *)0x0) {
    out_parameters = &local_48;
  }
  local_68.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (out_drag_parameters == (Dictionary *)0x0) {
    out_drag_parameters = &local_68;
  }
  pCVar11 = this;
  fStack_84 = (float)in_XMM0_Db;
  GenerateMouseEventParameters(this,out_parameters,-1);
  GenerateKeyModifierEventParameters(pCVar11,out_parameters,key_modifier_state);
  GenerateMouseEventParameters(this,out_drag_parameters,-1);
  pCVar11 = this;
  GenerateDragEventParameters(this,out_drag_parameters);
  GenerateKeyModifierEventParameters(pCVar11,out_drag_parameters,key_modifier_state);
  if (this->drag != (Element *)0x0) {
    if (((this->mouse_position).x != old_mouse_position.x) ||
       ((this->mouse_position).y != old_mouse_position.y)) {
      if (this->drag_started == false) {
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                  *)local_d8,&out_drag_parameters->m_container);
        pVVar8 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::operator[]<char_const(&)[8]>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_d8,(char (*) [8])"mouse_x");
        Variant::Clear(pVVar8);
        Variant::Set(pVVar8,old_mouse_position.x);
        pVVar8 = itlib::
                 flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                 ::operator[]<char_const(&)[8]>
                           ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                             *)local_d8,(char (*) [8])"mouse_y");
        Variant::Clear(pVVar8);
        Variant::Set(pVVar8,old_mouse_position.y);
        Element::DispatchEvent(this->drag,Dragstart,(Dictionary *)local_d8);
        this->drag_started = true;
        pCVar9 = Element::GetComputedValues(this->drag);
        if (((undefined1  [80])pCVar9->rare & (undefined1  [80])0x700000) ==
            (undefined1  [80])0x400000) {
          CreateDragClone(this,this->drag);
        }
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                   *)local_d8);
      }
      Element::DispatchEvent(this->drag,Drag,out_drag_parameters);
    }
  }
  uStack_80 = fStack_84;
  fStack_84 = (float)local_78._0_4_;
  uStack_7c = local_78._4_4_;
  if (this->mouse_active == true) {
    point.y = (float)local_78._0_4_;
    point.x = local_88;
    this_01 = GetElementAtPoint(this,point,(Element *)0x0,(Element *)0x0);
  }
  else {
    this_01 = (Element *)0x0;
  }
  this->hover = this_01;
  if (this->enable_cursor != true) goto LAB_001e85aa;
  ppVar4 = (pointer)(local_d8 + 0x10);
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
  this_00 = (this->scroll_controller)._M_t.
            super___uniq_ptr_impl<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
            ._M_t.
            super__Tuple_impl<0UL,_Rml::ScrollController_*,_std::default_delete<Rml::ScrollController>_>
            .super__Head_base<0UL,_Rml::ScrollController_*,_false>._M_head_impl;
  local_d8._0_8_ = ppVar4;
  if (this_00->mode == Autoscroll) {
    ScrollController::GetAutoscrollCursor_abi_cxx11_
              (&local_a8,this_00,this->mouse_position,this->density_independent_pixel_ratio);
LAB_001e8522:
    ::std::__cxx11::string::operator=((string *)local_d8,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (this->drag != (Element *)0x0) {
      pCVar9 = Element::GetComputedValues(this->drag);
      Style::ComputedValues::cursor_abi_cxx11_(&local_a8,pCVar9);
      goto LAB_001e8522;
    }
    if (this_01 != (Element *)0x0) {
      pCVar9 = Element::GetComputedValues(this_01);
      Style::ComputedValues::cursor_abi_cxx11_(&local_a8,pCVar9);
      goto LAB_001e8522;
    }
  }
  if ((pointer)local_d8._8_8_ == (pointer)(this->cursor_name)._M_string_length) {
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      iVar7 = bcmp((void *)local_d8._0_8_,(this->cursor_name)._M_dataplus._M_p,local_d8._8_8_);
      if (iVar7 != 0) goto LAB_001e8578;
    }
  }
  else {
LAB_001e8578:
    pSVar10 = GetSystemInterface();
    (*pSVar10->_vptr_SystemInterface[6])(pSVar10,local_d8);
    ::std::__cxx11::string::_M_assign((string *)&this->cursor_name);
  }
  if ((pointer)local_d8._0_8_ != ppVar4) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d8._16_8_)->_M_dataplus)._M_p + 1));
  }
LAB_001e85aa:
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_d8._16_8_ = (pointer)0x0;
  for (local_b0 = this->hover; local_b0 != (Element *)0x0;
      local_b0 = Element::GetParentNode(local_b0)) {
    itlib::
    flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
    ::insert<Rml::Element*&>
              ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                *)local_d8,&local_b0);
  }
  SendEvents(&this->hover_chain,(ElementSet *)local_d8,Mouseout,out_parameters);
  SendEvents((ElementSet *)local_d8,&this->hover_chain,Mouseover,out_parameters);
  if ((this->drag != (Element *)0x0) && (this->mouse_active == true)) {
    point_00.y = fStack_84;
    point_00.x = local_88;
    local_b0 = GetElementAtPoint(this,point_00,this->drag,(Element *)0x0);
    this->drag_hover = local_b0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    for (; local_b0 != (Element *)0x0; local_b0 = Element::GetParentNode(local_b0)) {
      itlib::
      flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
      ::insert<Rml::Element*&>
                ((flat_set<Rml::Element*,itlib::fsimpl::less,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                  *)&local_a8,&local_b0);
    }
    if ((this->drag_started == true) && (this->drag_verbose == true)) {
      SendEvents(&this->drag_hover_chain,(ElementSet *)&local_a8,Dragout,out_drag_parameters);
      SendEvents((ElementSet *)&local_a8,&this->drag_hover_chain,Dragover,out_drag_parameters);
    }
    ppEVar1 = (this->drag_hover_chain).m_container.
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppEVar2 = (this->drag_hover_chain).m_container.
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppEVar3 = (this->drag_hover_chain).m_container.
              super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_a8._M_dataplus._M_p;
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_a8._M_string_length;
    (this->drag_hover_chain).m_container.
    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
    local_a8._M_dataplus._M_p = (pointer)ppEVar1;
    local_a8._M_string_length = (size_type)ppEVar2;
    local_a8.field_2._M_allocated_capacity = (size_type)ppEVar3;
    if (ppEVar1 != (pointer)0x0) {
      operator_delete(ppEVar1,(long)ppEVar3 - (long)ppEVar1);
    }
  }
  ppVar4 = (pointer)(this->hover_chain).m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
  ppVar5 = (pointer)(this->hover_chain).m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  ppVar6 = (pointer)(this->hover_chain).m_container.
                    super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
  (this->hover_chain).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
  local_d8._0_8_ = ppVar4;
  local_d8._8_8_ = ppVar5;
  local_d8._16_8_ = ppVar6;
  if (ppVar4 != (pointer)0x0) {
    operator_delete(ppVar4,(long)ppVar6 - (long)ppVar4);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_68.m_container);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ::~vector(&local_48.m_container);
  return;
}

Assistant:

void Context::UpdateHoverChain(Vector2i old_mouse_position, int key_modifier_state, Dictionary* out_parameters, Dictionary* out_drag_parameters)
{
	const Vector2f position(mouse_position);

	Dictionary local_parameters, local_drag_parameters;
	Dictionary& parameters = out_parameters ? *out_parameters : local_parameters;
	Dictionary& drag_parameters = out_drag_parameters ? *out_drag_parameters : local_drag_parameters;

	// Generate the parameters for the mouse events (there could be a few!).
	GenerateMouseEventParameters(parameters);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	GenerateMouseEventParameters(drag_parameters);
	GenerateDragEventParameters(drag_parameters);
	GenerateKeyModifierEventParameters(drag_parameters, key_modifier_state);

	// Send out drag events.
	if (drag)
	{
		if (mouse_position != old_mouse_position)
		{
			if (!drag_started)
			{
				Dictionary drag_start_parameters = drag_parameters;
				drag_start_parameters["mouse_x"] = old_mouse_position.x;
				drag_start_parameters["mouse_y"] = old_mouse_position.y;
				drag->DispatchEvent(EventId::Dragstart, drag_start_parameters);
				drag_started = true;

				if (drag->GetComputedValues().drag() == Style::Drag::Clone)
				{
					// Clone the element and attach it to the mouse cursor.
					CreateDragClone(drag);
				}
			}

			drag->DispatchEvent(EventId::Drag, drag_parameters);
		}
	}

	hover = mouse_active ? GetElementAtPoint(position) : nullptr;

	if (enable_cursor)
	{
		String new_cursor_name;

		if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
			new_cursor_name = scroll_controller->GetAutoscrollCursor(mouse_position, density_independent_pixel_ratio);
		else if (drag)
			new_cursor_name = drag->GetComputedValues().cursor();
		else if (hover)
			new_cursor_name = hover->GetComputedValues().cursor();

		if (new_cursor_name != cursor_name)
		{
			GetSystemInterface()->SetMouseCursor(new_cursor_name);
			cursor_name = new_cursor_name;
		}
	}

	// Build the new hover chain.
	ElementSet new_hover_chain;
	Element* element = hover;
	while (element != nullptr)
	{
		new_hover_chain.insert(element);
		element = element->GetParentNode();
	}

	// Send mouseout / mouseover events.
	SendEvents(hover_chain, new_hover_chain, EventId::Mouseout, parameters);
	SendEvents(new_hover_chain, hover_chain, EventId::Mouseover, parameters);

	// Send out drag events.
	if (drag && mouse_active)
	{
		drag_hover = GetElementAtPoint(position, drag);

		ElementSet new_drag_hover_chain;
		element = drag_hover;
		while (element != nullptr)
		{
			new_drag_hover_chain.insert(element);
			element = element->GetParentNode();
		}

		if (drag_started && drag_verbose)
		{
			// Send out ondragover and ondragout events as appropriate.
			SendEvents(drag_hover_chain, new_drag_hover_chain, EventId::Dragout, drag_parameters);
			SendEvents(new_drag_hover_chain, drag_hover_chain, EventId::Dragover, drag_parameters);
		}

		drag_hover_chain.swap(new_drag_hover_chain);
	}

	// Swap the new chain in.
	hover_chain.swap(new_hover_chain);
}